

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

void __thiscall
deqp::gls::FboUtil::config::glDelete(config *this,Image *cfg,GLuint img,Functions *gl)

{
  long lVar1;
  undefined4 in_register_00000014;
  Functions *pFVar2;
  undefined4 local_1c;
  
  local_1c = SUB84(cfg,0);
  lVar1 = __dynamic_cast(this,&Image::typeinfo,&Renderbuffer::typeinfo,0);
  pFVar2 = (Functions *)CONCAT44(in_register_00000014,img);
  if ((lVar1 == 0) &&
     (lVar1 = __dynamic_cast(this,&Image::typeinfo,&Texture::typeinfo,0), pFVar2 = gl, lVar1 == 0))
  {
    return;
  }
  (*(code *)pFVar2)(1,&local_1c);
  return;
}

Assistant:

static void glDelete (const Image& cfg, GLuint img, const glw::Functions& gl)
{
	if (dynamic_cast<const Renderbuffer*>(&cfg) != DE_NULL)
		gl.deleteRenderbuffers(1, &img);
	else if (dynamic_cast<const Texture*>(&cfg) != DE_NULL)
		gl.deleteTextures(1, &img);
	else
		DE_FATAL("Impossible image type");
}